

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void test_all_maps<HashObject<4,4>>(int obj_size,int iters)

{
  _Hash_node_base *p_Var1;
  iterator iVar2;
  iterator iVar3;
  nonempty_iterator ppVar4;
  KeyInfo KVar5;
  long lVar6;
  value_type *pvVar7;
  long lVar8;
  value_type *pvVar9;
  value_type *pvVar10;
  pointer psVar11;
  value_type *pvVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  KeyInfo KVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  KeyInfo KVar18;
  uint uVar19;
  iterator iVar20;
  undefined7 uVar23;
  undefined8 uVar21;
  pointer psVar22;
  pointer end_memory;
  uchar *puVar24;
  size_t start_memory;
  size_t start_memory_00;
  pointer psVar25;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  pointer psVar26;
  size_t start_memory_05;
  size_t start_memory_06;
  ulong uVar27;
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *psVar28;
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *psVar29;
  uint uVar30;
  KeyInfo KVar31;
  KeyInfo KVar32;
  KeyInfo KVar33;
  int iVar34;
  int iVar35;
  bool bVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<4,_4>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<4,_4>,_int>_>_>
  pVar55;
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> set;
  uint local_16c;
  undefined1 local_160 [16];
  KeyInfo local_150;
  KeyInfo KStack_148;
  KeyInfo local_140;
  type local_138;
  vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  vStack_130;
  pointer local_118;
  pointer local_110;
  uint local_108;
  int local_104;
  int local_100;
  int local_fc;
  iterator local_f8;
  size_type local_b0;
  double local_a8;
  int local_a0;
  libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_> local_9a;
  equal_to<HashObject<4,_4>_*> local_99;
  ulong local_98;
  long local_90;
  ulong local_88;
  HashObject<4,_4> local_7c;
  sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  local_78;
  
  psVar26 = (pointer)(ulong)(uint)obj_size;
  iVar20._M_current = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",4);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar7->second = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)iVar20._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  local_b0 = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)local_160,local_b0);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar7->second = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar7->second = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar7->second = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar20._M_current =
         (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar38._8_4_ = (int)puVar24;
    auVar38._0_8_ = puVar24;
    auVar38._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar38 = auVar38 ^ _DAT_0013b020;
    auVar53 = _DAT_0013b010;
    do {
      auVar52 = auVar53 ^ auVar54;
      if ((bool)(~(auVar38._4_4_ < auVar52._4_4_ ||
                  auVar38._0_4_ < auVar52._0_4_ && auVar52._4_4_ == auVar38._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar52._12_4_ <= auVar38._12_4_ &&
          (auVar52._8_4_ <= auVar38._8_4_ || auVar52._12_4_ != auVar38._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4 + 4) = (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar6 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + 2;
      auVar53._8_8_ = lVar6 + 2;
    } while (iVar20._M_current != psVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseSparseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar20._M_current =
         (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar39._8_4_ = (int)puVar24;
    auVar39._0_8_ = puVar24;
    auVar39._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar39 = auVar39 ^ _DAT_0013b020;
    auVar52 = _DAT_0013b010;
    do {
      auVar53 = auVar52 ^ auVar54;
      if ((bool)(~(auVar39._4_4_ < auVar53._4_4_ ||
                  auVar39._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar39._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar53._12_4_ <= auVar39._12_4_ &&
          (auVar53._8_4_ <= auVar39._8_4_ || auVar53._12_4_ != auVar39._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4 + 4) = (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar6 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + 2;
      auVar52._8_8_ = lVar6 + 2;
    } while (iVar20._M_current != psVar22);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_7c.i_ = iVar34;
      google::
      sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
      ::find<HashObject<4,4>>
                (&local_f8,
                 (sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                  *)local_160,&local_7c);
      local_78.pos.row_begin._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_78.pos.row_end._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.pos.row_current._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.pos.col_current = (nonempty_iterator)0x0;
      local_78.end.row_begin._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_78.end.row_end._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.end.row_current._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.end.col_current = (nonempty_iterator)0x0;
      local_78.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)local_160;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::advance_past_deleted(&local_78);
      uVar19 = 1;
      iVar20._M_current = local_f8.pos.row_begin._M_current;
      if (((local_f8.pos.row_begin._M_current == local_78.pos.row_begin._M_current) &&
          (iVar20._M_current = local_f8.pos.row_end._M_current,
          local_f8.pos.row_end._M_current == local_78.pos.row_end._M_current)) &&
         (local_f8.pos.row_current._M_current == local_78.pos.row_current._M_current)) {
        if (local_f8.pos.row_current._M_current == local_f8.pos.row_end._M_current) {
          uVar19 = 0;
        }
        else {
          uVar19 = (uint)(local_f8.pos.col_current != local_78.pos.col_current);
          iVar20._M_current =
               (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                *)local_f8.pos.col_current;
        }
      }
      uVar30 = uVar30 ^ uVar19;
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar8 - lVar6),obj_size,start_memory,(size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar7->second = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      google::
      sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht._0_4_ = iVar34;
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar35 = iVar34 + 1;
      pvVar7->second = iVar35;
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      google::
      sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160,(key_type *)&local_f8);
      iVar34 = iVar35;
    } while (iVar35 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar7 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar7->second = iVar34;
    } while (obj_size != iVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::begin(&local_78,
          (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
           *)local_160);
  local_f8.ht = local_78.ht;
  local_f8.pos.row_begin._M_current = local_78.pos.row_begin._M_current;
  local_f8.pos.row_end._M_current = local_78.pos.row_end._M_current;
  local_f8.pos.row_current._M_current = local_78.pos.row_current._M_current;
  local_f8.pos.col_current = local_78.pos.col_current;
  local_f8.end.row_begin._M_current = local_78.end.row_begin._M_current;
  local_f8.end.row_end._M_current._0_4_ = local_78.end.row_end._M_current._0_4_;
  local_f8.end.row_end._M_current._4_4_ = local_78.end.row_end._M_current._4_4_;
  local_f8.end.row_current._M_current._0_4_ = local_78.end.row_current._M_current._0_4_;
  local_f8.end.row_current._M_current._4_4_ = local_78.end.row_current._M_current._4_4_;
  local_f8.end.col_current = local_78.end.col_current;
  local_78.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.row_current._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (nonempty_iterator)0x0;
  local_78.end.row_begin._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_78.end.row_end._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.row_current._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.col_current = (nonempty_iterator)0x0;
  psVar11 = vStack_130.
            super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_78.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                 *)local_160;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::advance_past_deleted(&local_78);
  ppVar4 = local_78.pos.col_current;
  iVar3._M_current = local_78.pos.row_current._M_current;
  iVar2._M_current = local_78.pos.row_end._M_current;
  iVar20._M_current = local_78.pos.row_begin._M_current;
  uVar30 = 1;
  while( true ) {
    bVar36 = iVar3._M_current != iVar2._M_current;
    uVar23 = (undefined7)((ulong)psVar11 >> 8);
    psVar11 = (pointer)CONCAT71(uVar23,bVar36);
    if (((local_f8.pos.row_begin._M_current == iVar20._M_current) &&
        (local_f8.pos.row_end._M_current == iVar2._M_current)) &&
       ((local_f8.pos.row_current._M_current == iVar3._M_current &&
        (psVar11 = (pointer)CONCAT71(uVar23,bVar36 && local_f8.pos.col_current != ppVar4),
        !bVar36 || local_f8.pos.col_current == ppVar4)))) break;
    uVar30 = uVar30 ^ *(uint *)((long)&(local_f8.pos.col_current)->first + 4);
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::operator++((sparse_hashtable_const_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                  *)&local_f8);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar8 - lVar6),obj_size,start_memory_00,(size_t)psVar11);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_130);
  putchar(10);
  local_a0 = obj_size + 3;
  if (-1 < obj_size) {
    local_a0 = obj_size;
  }
  local_a0 = local_a0 >> 2;
  uVar21 = CONCAT71((int7)((ulong)psVar11 >> 8),1);
  lVar6 = 0;
  do {
    local_108 = (uint)uVar21;
    uVar27 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar6];
    local_16c = 1;
    local_98 = uVar27;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar34 = local_a0 / (int)uVar27;
      google::
      sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
      ::sparse_hashtable((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                          *)local_160,0,(HashFn *)&local_7c,&local_99,(SelectKey *)&local_f8,
                         (SetKey *)&local_78,&local_9a);
      dVar37 = NAN;
      local_104 = iVar34;
      if (0 < iVar34) {
        local_a8 = 0.0;
        iVar34 = 0;
        iVar35 = 0;
        do {
          google::
          sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::clear((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                   *)local_160);
          google::
          sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::resize((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                    *)local_160,uVar27);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_100 = iVar35;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar27 >> 0x1f;
          iVar35 = (int)((long)((ulong)uVar30 << 0x20 | uVar27 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_16c));
          if (-1 < iVar35) {
            uVar19 = iVar35 + 1;
            local_88 = (ulong)uVar19;
            local_fc = (int)((long)((ulong)uVar30 << 0x20 | uVar27 & 0xffffffff) / (long)(int)uVar19
                            );
            uVar27 = 0;
            psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)(long)(int)local_16c;
            do {
              psVar29 = psVar28;
              iVar35 = local_fc;
              if (0 < local_fc) {
                do {
                  local_f8.ht = psVar29;
                  pvVar9 = google::
                           sparse_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                           ::
                           find_or_insert<google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::DefaultValue>
                                     ((sparse_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                                       *)local_160,(key_type *)&local_f8);
                  iVar34 = iVar34 + 1;
                  pvVar9->second = iVar34;
                  psVar29 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)((long)&(((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                                          *)(long)(int)local_16c)->settings).
                                       super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                       .enlarge_threshold_ +
                               (long)&(psVar29->settings).
                                      super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                      .enlarge_threshold_);
                  iVar35 = iVar35 + -1;
                } while (iVar35 != 0);
              }
              uVar27 = uVar27 + 1;
              psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                         *)((long)&(psVar28->settings).
                                   super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                   .enlarge_threshold_ + 1);
            } while (uVar27 != local_88);
          }
          lVar6 = std::chrono::_V2::steady_clock::now();
          local_a8 = local_a8 + (double)(lVar6 - local_90);
          iVar35 = local_100 + 1;
          uVar27 = local_98;
        } while (iVar35 != local_104);
        dVar37 = local_a8 / (double)iVar34;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar37,
             uVar27 & 0xffffffff,(ulong)local_16c);
      std::
      vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
      ::~vector(&vStack_130);
      local_16c = local_16c * (int)uVar27;
    } while ((int)local_16c <= (int)uVar27);
    lVar6 = 1;
    uVar21 = 0;
  } while ((local_108 & 1) != 0);
  psVar22 = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",4);
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar10->second = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)local_160,local_b0);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar10->second = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  iVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar10->second = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar10->second = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar40._8_4_ = (int)puVar24;
    auVar40._0_8_ = puVar24;
    auVar40._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar40 = auVar40 ^ _DAT_0013b020;
    auVar46 = _DAT_0013b010;
    do {
      auVar53 = auVar46 ^ auVar54;
      if ((bool)(~(auVar40._4_4_ < auVar53._4_4_ ||
                  auVar40._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar40._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar53._12_4_ <= auVar40._12_4_ &&
          (auVar53._8_4_ <= auVar40._8_4_ || auVar53._12_4_ != auVar40._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar6 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar6 + 2;
    } while (psVar22 != psVar25);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseDenseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar41._8_4_ = (int)puVar24;
    auVar41._0_8_ = puVar24;
    auVar41._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar41 = auVar41 ^ _DAT_0013b020;
    auVar47 = _DAT_0013b010;
    do {
      auVar53 = auVar47 ^ auVar54;
      if ((bool)(~(auVar41._4_4_ < auVar53._4_4_ ||
                  auVar41._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar41._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar53._12_4_ <= auVar41._12_4_ &&
          (auVar53._8_4_ <= auVar41._8_4_ || auVar53._12_4_ != auVar41._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar6 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 2;
      auVar47._8_8_ = lVar6 + 2;
    } while (psVar22 != psVar25);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  iVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  if (0 < obj_size) {
    do {
      local_78.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_78.ht._4_4_,iVar34);
      google::
      dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
      ::find<HashObject<4,4>>
                ((iterator *)&local_f8,
                 (dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                  *)local_160,(HashObject<4,_4> *)&local_78);
      bVar36 = local_f8.pos.row_begin._M_current !=
               (pointer)(local_118->bitmap +
                        (long)vStack_130.
                              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish * 8 + -10);
      psVar22 = (pointer)(ulong)bVar36;
      uVar30 = uVar30 ^ bVar36;
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar8 - lVar6),obj_size,start_memory_01,(size_t)psVar22);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  iVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar10->second = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      google::
      dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht._0_4_ = iVar34;
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar35 = iVar34 + 1;
      pvVar10->second = iVar35;
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      google::
      dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160,(key_type *)&local_f8);
      iVar34 = iVar35;
    } while (iVar35 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pvVar10 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_160,(HashObject<4,_4> *)&local_f8);
      iVar34 = iVar34 + 1;
      pvVar10->second = iVar34;
    } while (obj_size != iVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  psVar11 = local_118;
  if (vStack_130.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
LAB_0011ca5c:
    vStack_130.
    super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(local_118->bitmap +
                  (long)vStack_130.
                        super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish * 8 + -10);
    if (psVar11 !=
        vStack_130.
        super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar30 = 1;
      do {
        uVar30 = uVar30 ^ *(uint *)((long)&psVar11->group + 4);
        do {
          psVar11 = (pointer)&psVar11->settings;
          end_memory = vStack_130.
                       super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar11 ==
              vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011caaa;
        } while ((local_140.empty_key.i_ == *(int *)&((Settings *)psVar11)->num_buckets) ||
                (local_138 != (type)0x0 &&
                 local_140.delkey.i_ == *(int *)&((Settings *)psVar11)->num_buckets));
      } while (psVar11 !=
               vStack_130.
               super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      goto LAB_0011caaa;
    }
  }
  else {
    lVar8 = (long)vStack_130.
                  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish * 8;
    do {
      if ((local_140.empty_key.i_ != *(int *)&psVar11->group) &&
         (local_138 == (type)0x0 || local_140.delkey.i_ != *(int *)&psVar11->group))
      goto LAB_0011ca5c;
      psVar11 = (pointer)&psVar11->settings;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
  uVar30 = 1;
  end_memory = vStack_130.
               super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_0011caaa:
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar8 - lVar6),obj_size,start_memory_02,(size_t)end_memory);
  if (local_118 != (pointer)0x0) {
    free(local_118);
  }
  putchar(10);
  uVar21 = CONCAT71((int7)((ulong)end_memory >> 8),1);
  lVar6 = 0;
  do {
    local_108 = (uint)uVar21;
    uVar27 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar6];
    local_16c = 1;
    local_98 = uVar27;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar34 = local_a0 / (int)uVar27;
      EasyUseDenseHashMap<HashObject<4,_4>_*,_int,_HashFn>::EasyUseDenseHashMap
                ((EasyUseDenseHashMap<HashObject<4,_4>_*,_int,_HashFn> *)local_160);
      dVar37 = NAN;
      local_104 = iVar34;
      if (0 < iVar34) {
        local_a8 = 0.0;
        iVar35 = 0;
        iVar34 = 0;
        do {
          google::
          dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::clear((dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                   *)local_160);
          google::
          dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::resize((dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                    *)local_160,uVar27);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_100 = iVar34;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar27 >> 0x1f;
          iVar34 = (int)((long)((ulong)uVar30 << 0x20 | uVar27 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_16c));
          if (-1 < iVar34) {
            uVar19 = iVar34 + 1;
            local_88 = (ulong)uVar19;
            local_fc = (int)((long)((ulong)uVar30 << 0x20 | uVar27 & 0xffffffff) / (long)(int)uVar19
                            );
            uVar27 = 0;
            psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)(long)(int)local_16c;
            do {
              psVar29 = psVar28;
              iVar34 = local_fc;
              if (0 < local_fc) {
                do {
                  local_f8.ht = psVar29;
                  pvVar12 = google::
                            dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                            ::find_or_insert<int,HashObject<4,4>*>
                                      ((dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                                        *)local_160,(HashObject<4,_4> **)&local_f8);
                  iVar35 = iVar35 + 1;
                  pvVar12->second = iVar35;
                  psVar29 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)((long)&(((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                                          *)(long)(int)local_16c)->settings).
                                       super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                       .enlarge_threshold_ +
                               (long)&(psVar29->settings).
                                      super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                      .enlarge_threshold_);
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              uVar27 = uVar27 + 1;
              psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                         *)((long)&(psVar28->settings).
                                   super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                   .enlarge_threshold_ + 1);
            } while (uVar27 != local_88);
          }
          lVar6 = std::chrono::_V2::steady_clock::now();
          local_a8 = local_a8 + (double)(lVar6 - local_90);
          iVar34 = local_100 + 1;
          uVar27 = local_98;
        } while (iVar34 != local_104);
        dVar37 = local_a8 / (double)iVar35;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar37,
             uVar27 & 0xffffffff,(ulong)local_16c);
      if (local_110 != (pointer)0x0) {
        free(local_110);
      }
      local_16c = local_16c * (int)uVar27;
    } while ((int)local_16c <= (int)uVar27);
    lVar6 = 1;
    uVar21 = 0;
  } while ((local_108 & 1) != 0);
  psVar22 = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",4);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar13 = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_160,local_b0);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar13 = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar13 = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar13 = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar42._8_4_ = (int)puVar24;
    auVar42._0_8_ = puVar24;
    auVar42._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar42 = auVar42 ^ _DAT_0013b020;
    auVar48 = _DAT_0013b010;
    do {
      auVar53 = auVar48 ^ auVar54;
      if ((bool)(~(auVar42._4_4_ < auVar53._4_4_ ||
                  auVar42._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar42._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar53._12_4_ <= auVar42._12_4_ &&
          (auVar53._8_4_ <= auVar42._8_4_ || auVar53._12_4_ != auVar42._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar6 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 2;
      auVar48._8_8_ = lVar6 + 2;
    } while (psVar22 != psVar25);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar43._8_4_ = (int)puVar24;
    auVar43._0_8_ = puVar24;
    auVar43._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar43 = auVar43 ^ _DAT_0013b020;
    auVar49 = _DAT_0013b010;
    do {
      auVar53 = auVar49 ^ auVar54;
      if ((bool)(~(auVar43._4_4_ < auVar53._4_4_ ||
                  auVar43._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar43._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar53._12_4_ <= auVar43._12_4_ &&
          (auVar53._8_4_ <= auVar43._8_4_ || auVar53._12_4_ != auVar43._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar6 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + 2;
      auVar49._8_8_ = lVar6 + 2;
    } while (psVar22 != psVar25);
  }
  time_map_fetch<EasyUseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      iVar14 = std::
               _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_160,(key_type *)&local_f8);
      psVar22 = (pointer)(ulong)(iVar14.
                                 super__Node_iterator_base<std::pair<const_HashObject<4,_4>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar30 = uVar30 ^ iVar14.
                        super__Node_iterator_base<std::pair<const_HashObject<4,_4>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar8 - lVar6),obj_size,start_memory_03,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar13 = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      std::
      _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_160,&local_f8);
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht._0_4_ = iVar34;
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar35 = iVar34 + 1;
      *pmVar13 = iVar35;
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      std::
      _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_160,&local_f8);
      iVar34 = iVar35;
    } while (iVar35 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (KeyInfo)0x0;
  KStack_148 = (KeyInfo)0x0;
  local_140.delkey.i_ = 0x3f800000;
  local_138 = (type)0x0;
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar13 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar13 = iVar34;
    } while (obj_size != iVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  for (KVar15 = local_150; KVar15 != (KeyInfo)0x0;
      KVar15 = (KeyInfo)((_Hash_node_base *)KVar15)->_M_nxt) {
    uVar30 = uVar30 ^ *(uint *)((long)&((_Hash_node_base *)((long)KVar15 + 8))->_M_nxt + 4);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar8 - lVar6),obj_size,start_memory_04,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  putchar(10);
  uVar21 = CONCAT71((int7)((ulong)psVar22 >> 8),1);
  lVar6 = 0;
  do {
    local_108 = (uint)uVar21;
    uVar27 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar6];
    local_16c = 1;
    local_98 = uVar27;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      local_104 = local_a0 / (int)uVar27;
      local_160._0_8_ = &vStack_130;
      local_160._8_8_ = (pointer)0x1;
      local_150 = (KeyInfo)0x0;
      KStack_148 = (KeyInfo)0x0;
      local_140.delkey.i_ = 0x3f800000;
      local_138 = (type)0x0;
      vStack_130.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dVar37 = NAN;
      if (0 < local_104) {
        iVar35 = 0;
        iVar34 = 0;
        dVar37 = 0.0;
        KVar15 = local_150;
        do {
          while (local_a8 = dVar37, local_100 = iVar34, KVar15 != (KeyInfo)0x0) {
            p_Var1 = ((_Hash_node_base *)KVar15)->_M_nxt;
            operator_delete((void *)KVar15);
            iVar34 = local_100;
            dVar37 = local_a8;
            KVar15 = (KeyInfo)p_Var1;
          }
          memset((void *)local_160._0_8_,0,local_160._8_8_ << 3);
          local_150 = (KeyInfo)0x0;
          KStack_148 = (KeyInfo)0x0;
          std::
          _Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::rehash((_Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_160,uVar27);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar27 >> 0x1f;
          iVar34 = (int)((long)((ulong)uVar30 << 0x20 | uVar27 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_16c));
          if (-1 < iVar34) {
            uVar19 = iVar34 + 1;
            local_88 = (ulong)uVar19;
            local_fc = (int)((long)((ulong)uVar30 << 0x20 | uVar27 & 0xffffffff) / (long)(int)uVar19
                            );
            uVar27 = 0;
            psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)(long)(int)local_16c;
            do {
              psVar29 = psVar28;
              iVar34 = local_fc;
              if (0 < local_fc) {
                do {
                  local_f8.ht = psVar29;
                  pmVar16 = std::__detail::
                            _Map_base<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_160,(key_type *)&local_f8);
                  iVar35 = iVar35 + 1;
                  *pmVar16 = iVar35;
                  psVar29 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)((long)&(((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                                          *)(long)(int)local_16c)->settings).
                                       super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                       .enlarge_threshold_ +
                               (long)&(psVar29->settings).
                                      super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                      .enlarge_threshold_);
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
              uVar27 = uVar27 + 1;
              psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                         *)((long)&(psVar28->settings).
                                   super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                   .enlarge_threshold_ + 1);
            } while (uVar27 != local_88);
          }
          lVar6 = std::chrono::_V2::steady_clock::now();
          dVar37 = local_a8 + (double)(lVar6 - local_90);
          iVar34 = local_100 + 1;
          KVar15 = local_150;
          uVar27 = local_98;
        } while (local_100 + 1 != local_104);
        dVar37 = dVar37 / (double)iVar35;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar37,
             uVar27 & 0xffffffff,(ulong)local_16c);
      std::
      _Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_160);
      local_16c = local_16c * (int)uVar27;
    } while ((int)local_16c <= (int)uVar27);
    lVar6 = 1;
    uVar21 = 0;
  } while ((local_108 & 1) != 0);
  psVar22 = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",4);
  KVar15 = (KeyInfo)((long)local_160 + 8);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (KeyInfo)0x0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar17 = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (KeyInfo)0x0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar17 = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (KeyInfo)0x0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar17 = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar17 = iVar34;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar44._8_4_ = (int)puVar24;
    auVar44._0_8_ = puVar24;
    auVar44._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar44 = auVar44 ^ _DAT_0013b020;
    auVar50 = _DAT_0013b010;
    do {
      auVar53 = auVar50 ^ auVar54;
      if ((bool)(~(auVar53._4_4_ == auVar44._4_4_ && auVar44._0_4_ < auVar53._0_4_ ||
                  auVar44._4_4_ < auVar53._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4) = (int)psVar25;
      }
      if ((auVar53._12_4_ != auVar44._12_4_ || auVar53._8_4_ <= auVar44._8_4_) &&
          auVar53._12_4_ <= auVar44._12_4_) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar6 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + 2;
      auVar50._8_8_ = lVar6 + 2;
    } while (psVar22 != psVar25);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)&local_f8);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar45._8_4_ = (int)puVar24;
    auVar45._0_8_ = puVar24;
    auVar45._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar26 = (pointer)0x0;
    auVar45 = auVar45 ^ _DAT_0013b020;
    auVar51 = _DAT_0013b010;
    do {
      auVar53 = auVar51 ^ auVar54;
      if ((bool)(~(auVar53._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar53._0_4_ ||
                  auVar45._4_4_ < auVar53._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar26 * 4) = (int)psVar26;
      }
      if ((auVar53._12_4_ != auVar45._12_4_ || auVar53._8_4_ <= auVar45._8_4_) &&
          auVar53._12_4_ <= auVar45._12_4_) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar26 * 4 + 4) = (int)psVar26 + 1;
      }
      psVar26 = (pointer)((long)&psVar26->group + 2);
      lVar6 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + 2;
      auVar51._8_8_ = lVar6 + 2;
    } while (psVar22 != psVar26);
  }
  time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150.delkey.i_ = 0;
  local_150.empty_key.i_ = 0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    psVar22 = (pointer)0x0;
    do {
      iVar34 = (int)psVar22;
      KVar18 = KVar15;
      KVar33 = KVar15;
      KVar5 = local_150;
      if (local_150 != (KeyInfo)0x0) {
        do {
          KVar31 = KVar5;
          KVar32 = KVar18;
          iVar35 = ((type)((long)KVar31 + 0x20))->i_;
          KVar18 = KVar31;
          if (iVar35 < iVar34) {
            KVar18 = KVar32;
          }
          KVar5 = *(KeyInfo *)((type)((long)KVar31 + 0x10) + (ulong)(iVar35 < iVar34) * 2);
        } while (*(KeyInfo *)((type)((long)KVar31 + 0x10) + (ulong)(iVar35 < iVar34) * 2) !=
                 (KeyInfo)0x0);
        if (KVar18 != KVar15) {
          if (iVar35 < iVar34) {
            KVar31 = KVar32;
          }
          KVar33 = KVar18;
          if (iVar34 < ((type)((long)KVar31 + 0x20))->i_) {
            KVar33 = KVar15;
          }
        }
      }
      uVar30 = uVar30 ^ KVar33 != KVar15;
      psVar22 = (pointer)(ulong)(iVar34 + 1U);
    } while (iVar34 + 1U != obj_size);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar8 - lVar6),obj_size,start_memory_05,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  KVar15 = (KeyInfo)((long)local_160 + 8);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (KeyInfo)0x0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar17 = iVar34;
    } while (obj_size != iVar34);
    iVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pVar55 = std::
               _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      std::
      _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)local_160,(_Base_ptr)pVar55.first._M_node,(_Base_ptr)pVar55.second._M_node);
      iVar34 = iVar34 + 1;
    } while (obj_size != iVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (KeyInfo)0x0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht._0_4_ = iVar34;
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar35 = iVar34 + 1;
      *pmVar17 = iVar35;
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pVar55 = std::
               _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      std::
      _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)local_160,(_Base_ptr)pVar55.first._M_node,(_Base_ptr)pVar55.second._M_node);
      iVar34 = iVar35;
    } while (iVar35 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar6),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (KeyInfo)0x0;
  local_138 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_148 = KVar15;
  local_140 = KVar15;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar34 = 0;
    do {
      local_f8.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_f8.ht._4_4_,iVar34);
      pmVar17 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_160,(key_type *)&local_f8);
      iVar34 = iVar34 + 1;
      *pmVar17 = iVar34;
    } while (obj_size != iVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  for (KVar18 = KStack_148; KVar18 != KVar15;
      KVar18 = (KeyInfo)std::_Rb_tree_increment((_Rb_tree_node_base *)KVar18)) {
    uVar30 = uVar30 ^ *(uint *)((long)KVar18 + 0x24);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar8 - lVar6),obj_size,start_memory_06,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_160);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}